

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeodesicArcIntercept.cpp
# Opt level: O0

int GeoCalcs::GeodesicArcIntercept
              (LLPoint *pt1,double crs1,LLPoint *center,double radius,LLPoint *intPtC1,
              LLPoint *intPtC2,double dTol)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_178;
  double local_110;
  double c;
  double A;
  double B;
  double dAngle;
  double bcrs;
  double errarray [2];
  double distarray [2];
  double dErr;
  double rcrs;
  int i;
  int nIntersects;
  LLPoint pt;
  double dist;
  double crs;
  double perpDist;
  InverseResult result;
  LLPoint perpPt;
  double dDistFromPt;
  double dCrsFromPt;
  double dTol_local;
  LLPoint *intPtC2_local;
  LLPoint *intPtC1_local;
  double radius_local;
  LLPoint *center_local;
  double crs1_local;
  LLPoint *pt1_local;
  
  dCrsFromPt = dTol;
  dTol_local = (double)intPtC2;
  intPtC2_local = intPtC1;
  intPtC1_local = (LLPoint *)radius;
  radius_local = (double)center;
  center_local = (LLPoint *)crs1;
  crs1_local = (double)pt1;
  join_0x00001240_0x00001200_ = PerpIntercept(pt1,crs1,center,&dDistFromPt,&perpPt.longitude,dTol);
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&perpDist);
  DistVincenty((LLPoint *)&result.distance,(LLPoint *)radius_local,(InverseResult *)&perpDist);
  dVar5 = result.reverseAzimuth;
  if (result.reverseAzimuth <= (double)intPtC1_local) {
    if (dCrsFromPt <= ABS(result.reverseAzimuth - (double)intPtC1_local)) {
      DistVincenty((LLPoint *)&result.distance,(LLPoint *)crs1_local,(InverseResult *)&perpDist);
      dVar3 = cos(dVar5 / kSphereRadius);
      bVar1 = IsApprox(dVar3,0.0,1e-08);
      dVar6 = perpDist;
      dVar3 = kSphereRadius;
      if (bVar1) {
        pt1_local._4_4_ = 0;
      }
      else {
        dist = perpDist;
        dVar4 = cos((double)intPtC1_local / kSphereRadius);
        dVar5 = cos(dVar5 / kSphereRadius);
        dVar5 = acos(dVar4 / dVar5);
        pt.longitude = dVar3 * dVar5;
        _i = DestVincenty((LLPoint *)&result.distance,dVar6,pt.longitude);
        for (rcrs._0_4_ = 0; rcrs._0_4_ < 2; rcrs._0_4_ = rcrs._0_4_ + 1) {
          DistVincenty((LLPoint *)radius_local,(LLPoint *)&i,(InverseResult *)&perpDist);
          dVar3 = result.azimuth;
          dVar6 = (double)intPtC1_local - result.reverseAzimuth;
          errarray[1] = pt.longitude;
          bcrs = dVar6;
          DistVincenty((LLPoint *)&i,(LLPoint *)&result.distance,(InverseResult *)&perpDist);
          dVar5 = perpDist;
          DistVincenty((LLPoint *)radius_local,(LLPoint *)&i,(InverseResult *)&perpDist);
          dVar4 = SignAzimuthDifference(perpDist,result.azimuth);
          dVar5 = SignAzimuthDifference(dVar5,dVar3);
          dVar3 = ABS((dVar5 + 3.141592653589793) - ABS(dVar4));
          dVar5 = sin(dVar3);
          dVar4 = cos(ABS(dVar6) / kSphereRadius);
          dVar4 = acos(dVar5 * dVar4);
          dVar7 = sin(dVar4);
          dVar5 = kSphereRadius;
          local_110 = dVar6;
          if (dCrsFromPt <= ABS(dVar7)) {
            if (dCrsFromPt <= ABS(dVar4)) {
              dVar3 = sin(dVar6 / kSphereRadius);
              dVar4 = sin(dVar4);
              dVar3 = asin(dVar3 / dVar4);
              local_110 = dVar5 * dVar3;
            }
            else {
              dVar5 = cos(dVar3);
              local_110 = dVar6 / dVar5;
            }
          }
          if (dVar6 <= 0.0) {
            local_178 = pt.longitude - local_110;
          }
          else {
            local_178 = pt.longitude + local_110;
          }
          pt.longitude = local_178;
          _i = DestVincenty((LLPoint *)&result.distance,dist,local_178);
          DistVincenty((LLPoint *)radius_local,(LLPoint *)&i,(InverseResult *)&perpDist);
          errarray[0] = (double)intPtC1_local - result.reverseAzimuth;
          while (dVar5 = pt.longitude, dCrsFromPt < ABS(errarray[0])) {
            FindLinearRoot(errarray + 1,&bcrs,&pt.longitude);
            uVar2 = std::isnan(pt.longitude);
            if ((uVar2 & 1) != 0) break;
            _i = DestVincenty((LLPoint *)&result.distance,dist,pt.longitude);
            DistVincenty((LLPoint *)radius_local,(LLPoint *)&i,(InverseResult *)&perpDist);
            errarray[1] = dVar5;
            bcrs = errarray[0];
            errarray[0] = (double)intPtC1_local - result.reverseAzimuth;
          }
          if (rcrs._0_4_ == 0) {
            intPtC2_local->latitude = _i;
            intPtC2_local->longitude = pt.latitude;
          }
          else {
            if (rcrs._0_4_ != 1) break;
            *(double *)dTol_local = _i;
            *(double *)((long)dTol_local + 8) = pt.latitude;
          }
          dist = dist + 3.141592653589793;
          _i = DestVincenty((LLPoint *)&result.distance,dist,pt.longitude);
          DistVincenty((LLPoint *)radius_local,(LLPoint *)&i,(InverseResult *)&perpDist);
          bcrs = (double)intPtC1_local - result.reverseAzimuth;
        }
        pt1_local._4_4_ = 2;
      }
    }
    else {
      intPtC2_local->latitude = result.distance;
      intPtC2_local->longitude = perpPt.latitude;
      pt1_local._4_4_ = 1;
    }
  }
  else {
    pt1_local._4_4_ = 0;
  }
  return pt1_local._4_4_;
}

Assistant:

int GeodesicArcIntercept(const LLPoint &pt1, double crs1,
                             const LLPoint &center, double radius,
                             LLPoint &intPtC1, LLPoint &intPtC2, double dTol)
    {
        double dCrsFromPt, dDistFromPt;
        const LLPoint perpPt = PerpIntercept(pt1, crs1, center, dCrsFromPt, dDistFromPt, dTol);

        InverseResult result;
        DistVincenty(perpPt, center, result);

        if (result.distance > radius)
            return 0;

        if (fabs(result.distance - radius) < dTol)
        {
            intPtC1 = perpPt;
            return 1;
        }

        const double perpDist = result.distance;
        DistVincenty(perpPt, pt1, result);

        if (IsApprox(cos(perpDist / kSphereRadius), 0.0, 1e-8))
            return 0;

        double crs = result.azimuth;
        double dist = kSphereRadius * acos(cos(radius / kSphereRadius) / cos(perpDist / kSphereRadius));
        LLPoint pt = DestVincenty(perpPt, crs, dist);

        const int nIntersects = 2;
        for (int i = 0; i < nIntersects; i++)
        {
            DistVincenty(center, pt, result);
            const double rcrs = result.reverseAzimuth;
            const double dErr = radius - result.distance;

            double distarray[2], errarray[2];
            distarray[0] = dist;
            errarray[0] = dErr;

            DistVincenty(pt, perpPt, result);
            const double bcrs = result.azimuth;

            DistVincenty(center, pt, result);
            const double dAngle = fabs(SignAzimuthDifference(result.azimuth, result.reverseAzimuth));
            const double B = fabs(SignAzimuthDifference(bcrs, rcrs) + M_PI - dAngle);
            const double A = acos(sin(B) * cos(fabs(dErr) / kSphereRadius));
            double c;
            if (fabs(sin(A)) < dTol)
                c = dErr;
            else if (fabs(A) < dTol)
                c = dErr / cos(B);
            else
                c = kSphereRadius * asin(sin(dErr / kSphereRadius) / sin(A));

            dist = dErr > 0 ? dist + c : dist - c;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            distarray[1] = dist;
            errarray[1] = radius - result.distance;

            while (fabs(errarray[1]) > dTol)
            {
                FindLinearRoot(distarray, errarray, dist);
                if (std::isnan(dist))
                    break;

                pt = DestVincenty(perpPt, crs, dist);
                DistVincenty(center, pt, result);
                distarray[0] = distarray[1];
                errarray[0] = errarray[1];
                distarray[1] = dist;
                errarray[1] = radius - result.distance;
                
            }

            if (i == 0)
                intPtC1 = pt;
            else if (i == 1)
                intPtC2 = pt;
            else
                break;

            crs += M_PI;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            errarray[0] = radius - result.distance;
        }

        return nIntersects;
    }